

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_setup_multiple_outputs2(APITests *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  undefined8 in_RDI;
  string *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  allocator_type *in_stack_ffffffffffffff18;
  string *psVar1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  iterator in_stack_ffffffffffffff28;
  iterator piVar2;
  undefined1 *puVar3;
  int __val;
  undefined1 local_b9;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 *local_b0;
  undefined8 local_a8;
  vector local_a0 [27];
  undefined1 local_85 [13];
  string *local_78;
  string local_70 [32];
  undefined1 local_50 [32];
  string *local_30;
  undefined8 local_28;
  vector local_20 [32];
  
  __val = (int)((ulong)in_RDI >> 0x20);
  GPIO::setmode(BOARD);
  local_78 = local_70;
  std::__cxx11::to_string(__val);
  local_78 = (string *)local_50;
  std::__cxx11::to_string(__val);
  local_30 = local_70;
  local_28 = 2;
  puVar3 = local_85;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x13e06f);
  __l._M_len = (size_type)puVar3;
  __l._M_array = in_stack_ffffffffffffff28;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff20,__l,(allocator_type *)in_stack_ffffffffffffff18);
  local_b8 = 0;
  local_b4 = 1;
  local_b0 = &local_b8;
  local_a8 = 2;
  piVar2 = (iterator)&local_b9;
  std::allocator<int>::allocator((allocator<int> *)0x13e0c5);
  __l_00._M_len = (size_type)puVar3;
  __l_00._M_array = piVar2;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff20,__l_00,in_stack_ffffffffffffff18);
  GPIO::setup(local_20,OUT,local_a0);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff00);
  std::allocator<int>::~allocator((allocator<int> *)0x13e10d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x13e127);
  psVar1 = local_70;
  this_00 = (string *)&local_30;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar1);
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_multiple_outputs2()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup({std::to_string(pin_data.out_a), std::to_string(pin_data.out_b)}, GPIO::OUT, {GPIO::LOW, GPIO::HIGH});
        GPIO::cleanup();
    }